

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  pointer pbVar2;
  int iVar3;
  Value *pVVar4;
  string *psVar5;
  cmGlobalNinjaGenerator *pcVar6;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>__Any_data_ptr_cmSourceFile_ptr_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *__tmp_2;
  undefined8 uVar7;
  undefined8 uVar8;
  string *i;
  pointer path;
  String *pSVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  LinkedTargetDirs linked_directories;
  Value tdi;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string tdin;
  cmGeneratedFileStream tdif;
  _Any_data __tmp;
  _Any_data local_3b8;
  code *local_3a8;
  code *pcStack_3a0;
  _Any_data local_398;
  code *local_388;
  code *pcStack_380;
  string *local_378;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  Value local_340;
  String local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string local_2d8;
  ValueHolder local_2b8;
  char *pcStack_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  pointer local_298;
  undefined8 local_290;
  undefined8 local_288;
  char *local_280;
  undefined8 local_278;
  
  local_378 = config;
  Json::Value::Value(&local_340,objectValue);
  Json::Value::Value((Value *)&local_2b8,lang);
  pVVar4 = Json::Value::operator[](&local_340,"language");
  Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_2b8.int_ = 6;
  pcStack_2b0 = "CMAKE_";
  local_2a8._M_allocated_capacity = 0;
  local_298 = (lang->_M_dataplus)._M_p;
  local_2a8._8_8_ = lang->_M_string_length;
  local_290 = 0;
  local_288 = 0xc;
  local_280 = "_COMPILER_ID";
  local_278 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_2b8;
  cmCatViews((string *)local_370,views);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_370);
  Json::Value::Value((Value *)&local_3b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"compiler-id");
  Json::Value::operator=(pVVar4,(Value *)&local_3b8);
  Json::Value::~Value((Value *)&local_3b8);
  if ((String *)local_370._0_8_ != (String *)local_360) {
    operator_delete((void *)local_370._0_8_,local_360._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_2b8.int_ = 6;
  pcStack_2b0 = "CMAKE_";
  local_2a8._M_allocated_capacity = 0;
  local_298 = (lang->_M_dataplus)._M_p;
  local_2a8._8_8_ = lang->_M_string_length;
  local_290 = 0;
  local_288 = 0xc;
  local_280 = "_SIMULATE_ID";
  local_278 = 0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_2b8;
  cmCatViews((string *)local_370,views_00);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_370);
  Json::Value::Value((Value *)&local_3b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"compiler-simulate-id");
  Json::Value::operator=(pVVar4,(Value *)&local_3b8);
  Json::Value::~Value((Value *)&local_3b8);
  if ((String *)local_370._0_8_ != (String *)local_360) {
    operator_delete((void *)local_370._0_8_,local_360._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_2b8.int_ = 6;
  pcStack_2b0 = "CMAKE_";
  local_2a8._M_allocated_capacity = 0;
  local_298 = (lang->_M_dataplus)._M_p;
  local_2a8._8_8_ = lang->_M_string_length;
  local_290 = 0;
  local_288 = 0x1a;
  local_280 = "_COMPILER_FRONTEND_VARIANT";
  local_278 = 0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&local_2b8;
  cmCatViews((string *)local_370,views_01);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_370);
  Json::Value::Value((Value *)&local_3b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"compiler-frontend-variant");
  Json::Value::operator=(pVVar4,(Value *)&local_3b8);
  Json::Value::~Value((Value *)&local_3b8);
  if ((String *)local_370._0_8_ != (String *)local_360) {
    operator_delete((void *)local_370._0_8_,local_360._0_8_ + 1);
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  iVar3 = std::__cxx11::string::compare((char *)lang);
  if (iVar3 == 0) {
    this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&local_2b8,this_00,psVar5);
    std::__cxx11::string::operator=((string *)&local_318,(string *)&local_2b8.bool_);
    uVar7 = local_2a8._M_allocated_capacity;
    uVar8 = local_2b8;
    if (local_2b8 == &local_2a8) goto LAB_0041148b;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)lang);
    if (iVar3 != 0) goto LAB_0041148b;
    pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath
              ((string *)&local_3b8,
               &((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    (*(pcVar6->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x18])
              (&local_2b8,pcVar6,&local_3b8,local_378);
    std::__cxx11::string::operator=((string *)&local_318,(string *)&local_2b8.bool_);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8.string_,local_2a8._M_allocated_capacity + 1);
    }
    uVar7 = local_3a8;
    uVar8 = local_3b8._M_unused._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_unused._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_3a8) goto LAB_0041148b;
  }
  operator_delete((void *)uVar8,uVar7 + 1);
LAB_0041148b:
  if (local_318._M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    std::__cxx11::string::_M_assign((string *)&local_318);
  }
  Json::Value::Value((Value *)&local_2b8,&local_318);
  pVVar4 = Json::Value::operator[](&local_340,"module-dir");
  Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  iVar3 = std::__cxx11::string::compare((char *)lang);
  if (iVar3 == 0) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_3b8._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&local_3a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,"CMAKE_Fortran_SUBMODULE_SEP","");
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_3b8);
    Json::Value::Value((Value *)&local_2b8,psVar5);
    pVVar4 = Json::Value::operator[](&local_340,"submodule-sep");
    Json::Value::operator=(pVVar4,(Value *)&local_2b8);
    Json::Value::~Value((Value *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_3a8) {
      operator_delete(local_3b8._M_unused._M_object,(long)local_3a8 + 1);
    }
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_3b8._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&local_3a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,"CMAKE_Fortran_SUBMODULE_EXT","");
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_3b8);
    Json::Value::Value((Value *)&local_2b8,psVar5);
    pVVar4 = Json::Value::operator[](&local_340,"submodule-ext");
    Json::Value::operator=(pVVar4,(Value *)&local_2b8);
    Json::Value::~Value((Value *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_3a8) {
      operator_delete(local_3b8._M_unused._M_object,(long)local_3a8 + 1);
    }
  }
  else {
    std::__cxx11::string::compare((char *)lang);
  }
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_2b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"dir-cur-bld");
  Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_2b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"dir-cur-src");
  Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_2b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"dir-top-bld");
  Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  psVar5 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_2b8,psVar5);
  pVVar4 = Json::Value::operator[](&local_340,"dir-top-src");
  Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  Json::Value::Value((Value *)&local_2b8,arrayValue);
  pVVar4 = Json::Value::operator[](&local_340,"include-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&local_2f8,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,local_378);
  pbVar2 = local_2f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    path = local_2f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar5 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,path);
      Json::Value::Value((Value *)&local_2b8,psVar5);
      Json::Value::append(pVVar4,(Value *)&local_2b8);
      Json::Value::~Value((Value *)&local_2b8);
      path = path + 1;
    } while (path != pbVar2);
  }
  Json::Value::Value((Value *)&local_2b8,arrayValue);
  pVVar4 = Json::Value::operator[](&local_340,"linked-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((LinkedTargetDirs *)local_370,&this->super_cmCommonTargetGenerator,lang,local_378);
  if (local_370._0_8_ != local_370._8_8_) {
    pSVar9 = (String *)local_370._0_8_;
    do {
      Json::Value::Value((Value *)&local_2b8,pSVar9);
      Json::Value::append(pVVar4,(Value *)&local_2b8);
      Json::Value::~Value((Value *)&local_2b8);
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != (String *)local_370._8_8_);
  }
  Json::Value::Value((Value *)&local_2b8,arrayValue);
  pVVar4 = Json::Value::operator[](&local_340,"forward-modules-from-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&local_2b8);
  Json::Value::~Value((Value *)&local_2b8);
  if (local_360._8_8_ != local_350._M_allocated_capacity) {
    pSVar9 = (String *)local_360._8_8_;
    do {
      Json::Value::Value((Value *)&local_2b8,pSVar9);
      Json::Value::append(pVVar4,(Value *)&local_2b8);
      Json::Value::~Value((Value *)&local_2b8);
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != (String *)local_350._M_allocated_capacity);
  }
  psVar5 = local_378;
  local_2a8._8_8_ = 0;
  local_2a8._M_allocated_capacity = 0;
  pcStack_2b0 = (char *)0x0;
  local_2b8.int_ = 0;
  pcStack_380 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2182:20)>
                ::_M_invoke;
  local_388 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2182:20)>
              ::_M_manager;
  local_398._8_8_ = 0;
  pcStack_3a0 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2179:23)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2179:23)>
              ::_M_manager;
  local_3b8._8_8_ = 0;
  local_3b8._M_unused._M_object = this;
  local_398._M_unused._M_object = this;
  cmDyndepCollation::AddCollationInformation
            (&local_340,(this->super_cmCommonTargetGenerator).GeneratorTarget,local_378,
             (cmDyndepGeneratorCallbacks *)&local_3b8);
  GetTargetDependInfoPath(&local_2d8,this,lang,psVar5);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&local_2b8,&local_2d8,false,None);
  Json::operator<<((OStream *)&local_2b8,&local_340);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != (code *)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_360 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,
                    CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                             local_318.field_2._M_local_buf[0]) + 1);
  }
  Json::Value::~Value(&local_340);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));
  tdi["compiler-simulate-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));
  tdi["compiler-frontend-variant"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_FRONTEND_VARIANT"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  auto const linked_directories =
    this->GetLinkedTargetDirectories(lang, config);
  for (std::string const& l : linked_directories.Direct) {
    tdi_linked_target_dirs.append(l);
  }

  Json::Value& tdi_forward_modules_from_target_dirs =
    tdi["forward-modules-from-target-dirs"] = Json::arrayValue;
  for (std::string const& l : linked_directories.Forward) {
    tdi_forward_modules_from_target_dirs.append(l);
  }

  cmDyndepGeneratorCallbacks cb;
  cb.ObjectFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetObjectFilePath(sf, cnf);
  };
  cb.BmiFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetBmiFilePath(sf, cnf);
  };

#if !defined(CMAKE_BOOTSTRAP)
  cmDyndepCollation::AddCollationInformation(tdi, this->GeneratorTarget,
                                             config, cb);
#endif

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}